

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

IfcMatrix4 *
Assimp::IFC::ProjectOntoPlane
          (IfcMatrix4 *__return_storage_ptr__,
          vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour,
          TempMesh *in_mesh,bool *ok,IfcVector3 *nor_out)

{
  pointer *ppaVar1;
  iterator __position;
  pointer paVar2;
  IfcVector2 *vv;
  long lVar3;
  pointer paVar4;
  long lVar5;
  pointer paVar6;
  pointer paVar7;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  aiVector2t<double> aVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> out_contour2;
  double local_218;
  double local_188;
  IfcMatrix3 local_118;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  aiVector2t<double> local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  *ok = true;
  DerivePlaneCoordinateSpace(&local_118,in_mesh,ok,nor_out);
  dVar9 = local_118.a2;
  if (*ok == false) {
    __return_storage_ptr__->a1 = 1.0;
    __return_storage_ptr__->a2 = 0.0;
    __return_storage_ptr__->a3 = 0.0;
    __return_storage_ptr__->a4 = 0.0;
    __return_storage_ptr__->b1 = 0.0;
    __return_storage_ptr__->b2 = 1.0;
    __return_storage_ptr__->b3 = 0.0;
    __return_storage_ptr__->b4 = 0.0;
    __return_storage_ptr__->c1 = 0.0;
    __return_storage_ptr__->c2 = 0.0;
    __return_storage_ptr__->c3 = 1.0;
    __return_storage_ptr__->c4 = 0.0;
    __return_storage_ptr__->d1 = 0.0;
    __return_storage_ptr__->d2 = 0.0;
    __return_storage_ptr__->d3 = 0.0;
    __return_storage_ptr__->d4 = 1.0;
  }
  else {
    local_a8 = local_118.a1;
    uStack_a0 = 0;
    local_58 = local_118.b3;
    dStack_50 = local_118.b3;
    local_68 = local_118.a3;
    dStack_60 = local_118.a3;
    local_b8 = local_118.b1;
    uStack_b0 = 0;
    local_88 = local_118.b1 * 0.0;
    uStack_80 = 0;
    local_c8 = local_118.b2;
    dStack_c0 = local_118.b3;
    local_78 = local_118.b2 * 0.0;
    dStack_70 = local_118.b3 * 0.0;
    local_218 = 0.0;
    if (1e-05 <= ABS(dStack_70 * local_118.c2 * 0.0 +
                     local_118.c1 * dStack_70 * -0.0 +
                     local_78 * local_118.c1 * 0.0 +
                     local_118.c3 * local_78 * -0.0 +
                     local_88 * local_118.c3 * 0.0 +
                     local_118.c2 * local_88 * -0.0 +
                     ((local_118.a3 * local_118.b2 * 0.0 * 0.0 +
                      local_118.a3 * local_118.b1 * -0.0 * 0.0 +
                      local_118.a3 * local_118.b1 * local_118.c2 +
                      local_118.c2 * local_118.a3 * 0.0 * -0.0 +
                      local_118.a3 * 0.0 * local_118.c1 * 0.0 +
                      local_118.a2 * local_118.b1 * 0.0 * 0.0 +
                      ((local_118.a2 * 0.0 * local_118.c3 * 0.0 +
                       local_118.c1 * local_118.a2 * 0.0 * -0.0 +
                       local_118.a2 * local_118.b3 * local_118.c1 +
                       local_118.a2 * local_118.b3 * -0.0 * 0.0 +
                       local_118.c3 * local_118.a1 * 0.0 * -0.0 +
                       local_118.a1 * 0.0 * local_118.c2 * 0.0 +
                       ((local_118.a1 * local_118.b3 * 0.0 * 0.0 +
                        local_118.a1 * local_118.b2 * -0.0 * 0.0 +
                        local_118.a1 * local_118.b2 * local_118.c3) -
                       local_118.a1 * local_118.b3 * local_118.c2)) -
                      local_118.a2 * local_118.b1 * local_118.c3)) -
                     local_118.a3 * local_118.b2 * local_118.c1) + -1.0)) {
      __assert_fail("std::fabs(det-1) < 1e-5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x42e,
                    "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                   );
    }
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (out_contour,
               ((long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    dVar15 = local_a8;
    dVar11 = local_b8;
    dVar10 = dStack_c0;
    paVar6 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar7 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar6 == paVar7) {
      dVar27 = 10000000000.0;
      dVar28 = 10000000000.0;
      dVar17 = -10000000000.0;
      dVar20 = -10000000000.0;
      local_188 = -20000000000.0;
      paVar7 = paVar6;
    }
    else {
      dVar27 = 10000000000.0;
      dVar28 = 10000000000.0;
      dVar17 = -10000000000.0;
      dVar20 = -10000000000.0;
      dVar26 = -10000000000.0;
      dVar22 = 10000000000.0;
      local_218 = 0.0;
      local_48 = local_118.a2;
      dStack_40 = local_c8;
      dVar21 = local_c8;
      do {
        dVar16 = paVar6->x;
        dVar23 = paVar6->y;
        dVar25 = paVar6->z;
        dVar29 = dVar25 * local_118.a3 + dVar16 * dVar15 + dVar23 * local_118.a2;
        dVar30 = dVar25 * dVar10 + dVar16 * dVar11 + dVar23 * dVar21;
        dVar8 = dVar29 + 0.0;
        dVar14 = dVar30 + 0.0;
        __position._M_current =
             (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_contour->
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_118.a1 = dVar8;
          local_118.a2 = dVar14;
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out_contour,
                     __position,(aiVector2t<double> *)&local_118);
          local_118.a2 = local_48;
          dVar21 = dStack_40;
        }
        else {
          (__position._M_current)->x = dVar8;
          (__position._M_current)->y = dVar14;
          ppaVar1 = &(out_contour->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dVar23 = dVar25 * local_118.c3 + dVar16 * local_118.c1 + dVar23 * local_118.c2;
        dVar16 = dVar23 + 0.0;
        local_218 = local_218 + dVar16;
        dVar22 = (double)(-(ulong)(dVar22 < dVar23) & (ulong)dVar22 |
                         ~-(ulong)(dVar22 < dVar23) & (ulong)dVar16);
        dVar27 = (double)(~-(ulong)(dVar27 < dVar29) & (ulong)dVar8 |
                         (ulong)dVar27 & -(ulong)(dVar27 < dVar29));
        dVar28 = (double)(~-(ulong)(dVar28 < dVar30) & (ulong)dVar14 |
                         (ulong)dVar28 & -(ulong)(dVar28 < dVar30));
        dVar17 = (double)(~-(ulong)(dVar29 < dVar17) & (ulong)dVar8 |
                         (ulong)dVar17 & -(ulong)(dVar29 < dVar17));
        dVar20 = (double)(~-(ulong)(dVar30 < dVar20) & (ulong)dVar14 |
                         (ulong)dVar20 & -(ulong)(dVar30 < dVar20));
        dVar26 = (double)(-(ulong)(dVar23 < dVar26) & (ulong)dVar26 |
                         ~-(ulong)(dVar23 < dVar26) & (ulong)dVar16);
        paVar6 = paVar6 + 1;
      } while (paVar6 != paVar7);
      paVar6 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_188 = (dVar26 - dVar22) + 1e-08;
      paVar7 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    auVar13 = _DAT_006ad2b0;
    lVar3 = ((long)paVar6 - (long)paVar7 >> 3) * -0x5555555555555555;
    auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar12._0_8_ = lVar3;
    auVar12._12_4_ = 0x45300000;
    auVar24._0_8_ = dVar17 - dVar27;
    auVar24._8_8_ = dVar20 - dVar28;
    paVar4 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    paVar2 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar4 != paVar2) {
      do {
        auVar18._0_8_ = paVar4->x - dVar27;
        auVar18._8_8_ = paVar4->y - dVar28;
        auVar18 = divpd(auVar18,auVar24);
        auVar18 = maxpd(ZEXT816(0),auVar18);
        aVar19 = (aiVector2t<double>)minpd(auVar13,auVar18);
        *paVar4 = aVar19;
        paVar4 = paVar4 + 1;
      } while (paVar4 != paVar2);
      paVar7 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar6 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    auVar13 = divpd(_DAT_006ad2b0,auVar24);
    dVar8 = -local_218 /
            ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    dVar10 = auVar13._0_8_;
    dVar11 = auVar13._8_8_;
    dVar25 = local_a8 * 0.0 + local_88;
    dVar26 = dVar9 * 0.0 + local_78;
    dVar23 = local_118.a3 * 0.0 + dStack_70;
    dVar27 = -dVar27 * dVar10;
    dVar28 = -dVar28 * dVar11;
    dVar17 = dVar27 * 0.0 + dVar10 * local_a8 + local_88 + local_118.c1 * 0.0;
    dVar20 = dVar27 * 0.0 + dVar10 * dVar9 + local_78 + local_118.c2 * 0.0;
    dVar21 = dVar28 * 0.0 + local_a8 * 0.0 + local_b8 * dVar11 + local_118.c1 * 0.0;
    dVar22 = dVar28 * 0.0 + dVar9 * 0.0 + local_c8 * dVar11 + local_118.c2 * 0.0;
    dVar9 = dVar27 * 0.0 + local_118.c3 * 0.0 + local_68 * dVar10 + dStack_70;
    dVar15 = dVar28 * 0.0 + local_118.c3 * 0.0 + dStack_60 * 0.0 + local_58 * dVar11;
    dVar27 = dVar10 * 0.0 + 0.0 + 0.0 + dVar27;
    dVar28 = dVar11 * 0.0 + 0.0 + dVar28;
    dVar10 = dVar8 * 0.0;
    dVar16 = dVar23 + local_118.c3 + dVar10;
    dVar11 = dVar10 + dVar25 + local_118.c1;
    dVar10 = dVar10 + dVar26 + local_118.c2;
    dVar8 = dVar8 + 0.0;
    local_118.a1 = 0.0;
    local_118.a2 = 0.0;
    local_118.a3 = 0.0;
    if (paVar7 != paVar6) {
      do {
        dVar14 = paVar7->x;
        dVar29 = paVar7->y;
        dVar30 = paVar7->z;
        local_98.x = dVar30 * dVar9 + dVar14 * dVar17 + dVar29 * dVar20 + dVar27;
        local_98.y = dVar30 * dVar15 + dVar14 * dVar21 + dVar29 * dVar22 + dVar28;
        if (local_118.a2 == local_118.a3) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_118,
                     (iterator)local_118.a2,&local_98);
        }
        else {
          *(double *)local_118.a2 = local_98.x;
          *(double *)((long)local_118.a2 + 8) = local_98.y;
          local_118.a2 = (double)((long)local_118.a2 + 0x10);
        }
        if (local_188 <= ABS(dVar30 * dVar16 + dVar14 * dVar11 + dVar29 * dVar10 + dVar8)) {
          __assert_fail("std::fabs(vv.z) < vmax.z + 1e-8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46a,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        paVar7 = paVar7 + 1;
      } while (paVar7 != paVar6);
    }
    paVar4 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(out_contour->
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar4;
    if (lVar3 != 0) {
      lVar3 = lVar3 >> 4;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      lVar5 = 8;
      do {
        dVar14 = *(double *)((long)paVar4 + lVar5 + -8) -
                 *(double *)((long)local_118.a1 + lVar5 + -8);
        dVar29 = *(double *)((long)&paVar4->x + lVar5) - *(double *)((long)local_118.a1 + lVar5);
        if (1e-06 <= dVar14 * dVar14 + dVar29 * dVar29) {
          __assert_fail("(out_contour[i]-out_contour2[i]).SquareLength() < 1e-6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46e,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        lVar5 = lVar5 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    __return_storage_ptr__->a1 = dVar17;
    __return_storage_ptr__->a2 = dVar20;
    __return_storage_ptr__->a3 = dVar9;
    __return_storage_ptr__->a4 = dVar27;
    __return_storage_ptr__->b1 = dVar21;
    __return_storage_ptr__->b2 = dVar22;
    __return_storage_ptr__->b3 = dVar15;
    __return_storage_ptr__->b4 = dVar28;
    __return_storage_ptr__->c1 = dVar11;
    __return_storage_ptr__->c2 = dVar10;
    __return_storage_ptr__->c3 = dVar16;
    __return_storage_ptr__->c4 = dVar8;
    __return_storage_ptr__->d1 = local_118.c1 * 0.0 + dVar25 + 0.0;
    __return_storage_ptr__->d2 = local_118.c2 * 0.0 + dVar26 + 0.0;
    __return_storage_ptr__->d3 = local_118.c3 * 0.0 + dVar23 + 0.0;
    __return_storage_ptr__->d4 = 1.0;
    if ((void *)local_118.a1 != (void *)0x0) {
      operator_delete((void *)local_118.a1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IfcMatrix4 ProjectOntoPlane(std::vector<IfcVector2>& out_contour, const TempMesh& in_mesh,
    bool &ok, IfcVector3& nor_out)
{
    const std::vector<IfcVector3>& in_verts = in_mesh.mVerts;
    ok = true;

    IfcMatrix4 m = IfcMatrix4(DerivePlaneCoordinateSpace(in_mesh, ok, nor_out));
    if(!ok) {
        return IfcMatrix4();
    }
#ifdef ASSIMP_BUILD_DEBUG
    const IfcFloat det = m.Determinant();
    ai_assert(std::fabs(det-1) < 1e-5);
#endif

    IfcFloat zcoord = 0;
    out_contour.reserve(in_verts.size());


    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);

    // Project all points into the new coordinate system, collect min/max verts on the way
    for(const IfcVector3& x : in_verts) {
        const IfcVector3 vv = m * x;
        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).

        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }
        zcoord += vv.z;
        vmin = std::min(vv, vmin);
        vmax = std::max(vv, vmax);

        out_contour.push_back(IfcVector2(vv.x,vv.y));
    }

    zcoord /= in_verts.size();

    // Further improve the projection by mapping the entire working set into
    // [0,1] range. This gives us a consistent data range so all epsilons
    // used below can be constants.
    vmax -= vmin;
    for(IfcVector2& vv : out_contour) {
        vv.x  = (vv.x - vmin.x) / vmax.x;
        vv.y  = (vv.y - vmin.y) / vmax.y;

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);
    }

    IfcMatrix4 mult;
    mult.a1 = static_cast<IfcFloat>(1.0) / vmax.x;
    mult.b2 = static_cast<IfcFloat>(1.0) / vmax.y;

    mult.a4 = -vmin.x * mult.a1;
    mult.b4 = -vmin.y * mult.b2;
    mult.c4 = -zcoord;
    m = mult * m;

    // debug code to verify correctness
#ifdef ASSIMP_BUILD_DEBUG
    std::vector<IfcVector2> out_contour2;
    for(const IfcVector3& x : in_verts) {
        const IfcVector3& vv = m * x;

        out_contour2.push_back(IfcVector2(vv.x,vv.y));
        ai_assert(std::fabs(vv.z) < vmax.z + 1e-8);
    }

    for(size_t i = 0; i < out_contour.size(); ++i) {
        ai_assert((out_contour[i]-out_contour2[i]).SquareLength() < 1e-6);
    }
#endif

    return m;
}